

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderFragDataTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderFragDataTests::init(ShaderFragDataTests *this,EVP_PKEY_CTX *ctx)

{
  pointer *this_00;
  TestContext *testCtx;
  bool bVar1;
  int extraout_EAX;
  FragDataIndexingCase *pFVar2;
  RenderContext *renderCtx;
  ContextInfo *contextInfo;
  reference ppTVar3;
  __normal_iterator<tcu::TestNode_**,_std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>_>
  local_60;
  __normal_iterator<tcu::TestNode_**,_std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>_>
  local_58;
  iterator i;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> negativeCases;
  ShaderLibrary library;
  ShaderFragDataTests *this_local;
  
  pFVar2 = (FragDataIndexingCase *)operator_new(0x80);
  Functional::anon_unknown_0::FragDataIndexingCase::FragDataIndexingCase
            (pFVar2,(this->super_TestCaseGroup).m_context,"valid_static_index",
             "Valid gl_FragData[] assignment using static index",INDEX_EXPR_STATIC);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar2);
  pFVar2 = (FragDataIndexingCase *)operator_new(0x80);
  Functional::anon_unknown_0::FragDataIndexingCase::FragDataIndexingCase
            (pFVar2,(this->super_TestCaseGroup).m_context,"valid_uniform_index",
             "Valid gl_FragData[] assignment using uniform index",INDEX_EXPR_UNIFORM);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar2);
  pFVar2 = (FragDataIndexingCase *)operator_new(0x80);
  Functional::anon_unknown_0::FragDataIndexingCase::FragDataIndexingCase
            (pFVar2,(this->super_TestCaseGroup).m_context,"valid_dynamic_index",
             "Valid gl_FragData[] assignment using dynamic index",INDEX_EXPR_DYNAMIC);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar2);
  testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  renderCtx = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  contextInfo = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  this_00 = &negativeCases.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  deqp::gls::ShaderLibrary::ShaderLibrary((ShaderLibrary *)this_00,testCtx,renderCtx,contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&i,
             (ShaderLibrary *)this_00,"shaders/fragdata.test");
  local_58._M_current =
       (TestNode **)
       std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::begin
                 ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&i);
  while( true ) {
    local_60._M_current =
         (TestNode **)
         std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::end
                   ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&i);
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<tcu::TestNode_**,_std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>_>
              ::operator*(&local_58);
    tcu::TestNode::addChild((TestNode *)this,*ppTVar3);
    __gnu_cxx::
    __normal_iterator<tcu::TestNode_**,_std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>_>
    ::operator++(&local_58,0);
  }
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&i);
  deqp::gls::ShaderLibrary::~ShaderLibrary
            ((ShaderLibrary *)
             &negativeCases.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return extraout_EAX;
}

Assistant:

void ShaderFragDataTests::init (void)
{
	addChild(new FragDataIndexingCase(m_context, "valid_static_index",	"Valid gl_FragData[] assignment using static index",	INDEX_EXPR_STATIC));
	addChild(new FragDataIndexingCase(m_context, "valid_uniform_index",	"Valid gl_FragData[] assignment using uniform index",	INDEX_EXPR_UNIFORM));
	addChild(new FragDataIndexingCase(m_context, "valid_dynamic_index",	"Valid gl_FragData[] assignment using dynamic index",	INDEX_EXPR_DYNAMIC));

	// Negative cases.
	{
		gls::ShaderLibrary library(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
		std::vector<tcu::TestNode*> negativeCases = library.loadShaderFile("shaders/fragdata.test");

		for (std::vector<tcu::TestNode*>::iterator i = negativeCases.begin(); i != negativeCases.end(); i++)
			addChild(*i);
	}
}